

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_record.c
# Opt level: O3

void rec_func_setup(jit_State *J)

{
  byte bVar1;
  GCproto *pGVar2;
  TRef *pTVar3;
  ulong uVar4;
  undefined1 auVar5 [16];
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 in_XMM1 [16];
  undefined1 auVar11 [16];
  undefined1 in_XMM2 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  
  auVar5 = _DAT_00162620;
  pGVar2 = J->pt;
  if ((pGVar2->flags & 8) != 0) {
    lj_trace_err(J,LJ_TRERR_CJITOFF);
  }
  if (0xf9 < (uint)pGVar2->framesize + J->baseslot) {
    lj_trace_err(J,LJ_TRERR_STACKOV);
  }
  bVar1 = pGVar2->numparams;
  uVar6 = (ulong)J->maxslot;
  if (J->maxslot < (uint)bVar1) {
    pTVar3 = J->base;
    lVar8 = (uint)bVar1 - uVar6;
    lVar9 = lVar8 + -1;
    auVar10._8_4_ = (int)lVar9;
    auVar10._0_8_ = lVar9;
    auVar10._12_4_ = (int)((ulong)lVar9 >> 0x20);
    uVar7 = 0;
    auVar11 = pmovsxbq(in_XMM1,0x302);
    auVar12 = pmovsxbq(in_XMM2,0x100);
    auVar10 = auVar10 ^ _DAT_00162620;
    do {
      uVar4 = auVar5._0_8_;
      lVar9 = auVar10._0_8_;
      if ((bool)(~(lVar9 < (long)(uVar7 ^ uVar4)) & 1)) {
        pTVar3[uVar6 + uVar7] = 0x7fff;
      }
      auVar13._8_4_ = (int)uVar7;
      auVar13._0_8_ = uVar7;
      auVar13._12_4_ = (int)(uVar7 >> 0x20);
      if ((long)((auVar13._8_8_ | auVar12._8_8_) ^ auVar5._8_8_) <= auVar10._8_8_) {
        pTVar3[uVar6 + uVar7 + 1] = 0x7fff;
      }
      if ((long)((uVar7 | auVar11._0_8_) ^ uVar4) <= lVar9) {
        pTVar3[uVar6 + uVar7 + 2] = 0x7fff;
        pTVar3[uVar6 + uVar7 + 3] = 0x7fff;
      }
      uVar7 = uVar7 + 4;
    } while ((lVar8 + 3U & 0xfffffffffffffffc) != uVar7);
  }
  J->maxslot = (uint)bVar1;
  return;
}

Assistant:

static void rec_func_setup(jit_State *J)
{
  GCproto *pt = J->pt;
  BCReg s, numparams = pt->numparams;
  if ((pt->flags & PROTO_NOJIT))
    lj_trace_err(J, LJ_TRERR_CJITOFF);
  if (J->baseslot + pt->framesize >= LJ_MAX_JSLOTS)
    lj_trace_err(J, LJ_TRERR_STACKOV);
  /* Fill up missing parameters with nil. */
  for (s = J->maxslot; s < numparams; s++)
    J->base[s] = TREF_NIL;
  /* The remaining slots should never be read before they are written. */
  J->maxslot = numparams;
}